

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SockAddr.cpp
# Opt level: O2

char * AGSSock::SockAddr_get_IP(SockAddr *sa)

{
  sa_family_t sVar1;
  socklen_t __len;
  char *pcVar2;
  int __af;
  char buffer [16];
  
  sVar1 = (sa->super_sockaddr_storage).ss_family;
  if (sVar1 == 10) {
    pcVar2 = (sa->super_sockaddr_storage).__ss_padding + 6;
    __af = 10;
    __len = 0x2e;
  }
  else {
    if (sVar1 != 2) {
      return (char *)0x0;
    }
    pcVar2 = (sa->super_sockaddr_storage).__ss_padding + 2;
    __af = 2;
    __len = 0x10;
  }
  buffer[8] = '\0';
  buffer[9] = '\0';
  buffer[10] = '\0';
  buffer[0xb] = '\0';
  buffer[0xc] = '\0';
  buffer[0xd] = '\0';
  buffer[0xe] = '\0';
  buffer[0xf] = '\0';
  buffer[0] = '\0';
  buffer[1] = '\0';
  buffer[2] = '\0';
  buffer[3] = '\0';
  buffer[4] = '\0';
  buffer[5] = '\0';
  buffer[6] = '\0';
  buffer[7] = '\0';
  inet_ntop(__af,pcVar2,buffer,__len);
  pcVar2 = (char *)(**(code **)(*AGSSockAPI::engine + 0x248))(AGSSockAPI::engine,buffer);
  return pcVar2;
}

Assistant:

const char *SockAddr_get_IP(SockAddr *sa)
{
	if (sa->ss_family == AF_INET)
	{
		char buffer[INET_ADDRSTRLEN] = "";
		sockaddr_in *addr = reinterpret_cast<sockaddr_in *> (sa);
		inet_ntop(sa->ss_family, &addr->sin_addr, buffer, sizeof (buffer));
		return AGS_STRING(buffer);
	}
	else if (sa->ss_family == AF_INET6)
	{
		char buffer[INET6_ADDRSTRLEN] = "";
		sockaddr_in6 *addr = reinterpret_cast<sockaddr_in6 *> (sa);
		inet_ntop(sa->ss_family, &addr->sin6_addr, buffer, sizeof (buffer));
		return AGS_STRING(buffer);
	}
	return nullptr;
}